

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProcessHelper.cpp
# Opt level: O1

uint Assimp::GetMeshVFormatUnique(aiMesh *pcMesh)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  bool bVar4;
  byte bVar5;
  uint uVar6;
  long lVar7;
  
  if (pcMesh == (aiMesh *)0x0) {
    __assert_fail("__null != pcMesh",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/code/PostProcessing/ProcessHelper.cpp"
                  ,0xb6,"unsigned int Assimp::GetMeshVFormatUnique(const aiMesh *)");
  }
  uVar1 = pcMesh->mNumVertices;
  bVar4 = uVar1 != 0 && pcMesh->mNormals != (aiVector3D *)0x0;
  uVar6 = bVar4 + 1 + (uint)bVar4;
  uVar3 = bVar4 + 5 + (uint)bVar4;
  if (uVar1 == 0) {
    uVar3 = uVar6;
  }
  if (pcMesh->mBitangents == (aiVector3D *)0x0) {
    uVar3 = uVar6;
  }
  if (pcMesh->mTangents == (aiVector3D *)0x0) {
    uVar3 = uVar6;
  }
  lVar7 = 0;
  do {
    if ((pcMesh->mTextureCoords[lVar7] == (aiVector3D *)0x0) || (uVar1 == 0)) break;
    iVar2 = 0x10000 << ((byte)lVar7 & 0x1f);
    if (pcMesh->mNumUVComponents[lVar7] != 3) {
      iVar2 = 0;
    }
    uVar3 = iVar2 + (0x100 << ((byte)lVar7 & 0x1f)) | uVar3;
    lVar7 = lVar7 + 1;
  } while (lVar7 != 8);
  lVar7 = 0;
  while( true ) {
    if (pcMesh->mColors[lVar7] == (aiColor4D *)0x0) {
      return uVar3;
    }
    if (uVar1 == 0) break;
    bVar5 = (byte)lVar7;
    lVar7 = lVar7 + 1;
    uVar3 = uVar3 | 0x1000000 << (bVar5 & 0x1f);
    if (lVar7 == 8) {
      return uVar3;
    }
  }
  return uVar3;
}

Assistant:

unsigned int GetMeshVFormatUnique(const aiMesh* pcMesh)
{
    ai_assert(NULL != pcMesh);

    // FIX: the hash may never be 0. Otherwise a comparison against
    // nullptr could be successful
    unsigned int iRet = 1;

    // normals
    if (pcMesh->HasNormals())iRet |= 0x2;
    // tangents and bitangents
    if (pcMesh->HasTangentsAndBitangents())iRet |= 0x4;

#ifdef BOOST_STATIC_ASSERT
    BOOST_STATIC_ASSERT(8 >= AI_MAX_NUMBER_OF_COLOR_SETS);
    BOOST_STATIC_ASSERT(8 >= AI_MAX_NUMBER_OF_TEXTURECOORDS);
#endif

    // texture coordinates
    unsigned int p = 0;
    while (pcMesh->HasTextureCoords(p))
    {
        iRet |= (0x100 << p);
        if (3 == pcMesh->mNumUVComponents[p])
            iRet |= (0x10000 << p);

        ++p;
    }
    // vertex colors
    p = 0;
    while (pcMesh->HasVertexColors(p))iRet |= (0x1000000 << p++);
    return iRet;
}